

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11_meta_dealloc(PyObject *obj)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  internals *piVar3;
  _Hash_node_base *p_Var4;
  _Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> __it;
  ulong uVar5;
  internals *piVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  type_index tindex;
  _Hash_node_base *local_38;
  internals *local_30;
  
  piVar3 = pybind11::detail::get_internals();
  uVar1 = (piVar3->registered_types_py)._M_h._M_bucket_count;
  uVar5 = (ulong)obj % uVar1;
  p_Var7 = (piVar3->registered_types_py)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var7->_M_nxt, p_Var8 = p_Var7, (PyObject *)p_Var7->_M_nxt[1]._M_nxt != obj)) {
    while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var8 = p_Var7, (PyObject *)p_Var4[1]._M_nxt == obj)) goto LAB_0010b399;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0010b399:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var8->_M_nxt;
  }
  if (((p_Var4 != (_Hash_node_base *)0x0) && ((long)p_Var4[3]._M_nxt - (long)p_Var4[2]._M_nxt == 8))
     && (p_Var4 = (p_Var4[2]._M_nxt)->_M_nxt, (PyObject *)p_Var4->_M_nxt == obj)) {
    local_38 = p_Var4[1]._M_nxt;
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(piVar3->direct_conversions)._M_h);
    piVar6 = piVar3;
    if (((ulong)p_Var4[0x12]._M_nxt & 8) != 0) {
      if (pybind11::detail::registered_local_types_cpp()::locals == '\0') {
        pybind11_meta_dealloc_cold_1();
        piVar6 = local_30;
      }
      else {
        piVar6 = (internals *)pybind11::detail::registered_local_types_cpp()::locals;
      }
    }
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)piVar6,&local_38);
    std::
    _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(piVar3->registered_types_py)._M_h,p_Var4);
    __it._M_cur = (__node_type *)(piVar3->inactive_override_cache)._M_h._M_before_begin._M_nxt;
    if (__it._M_cur != (__node_type *)0x0) {
      do {
        if (*(_Hash_node_base **)((long)__it._M_cur + 8) == p_Var4->_M_nxt) {
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::override_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::erase(&(piVar3->inactive_override_cache)._M_h,__it._M_cur);
        }
        else {
          __it._M_cur = *__it._M_cur;
        }
      } while (__it._M_cur != (__node_type *)0x0);
    }
    p_Var2 = p_Var4[0xb]._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      operator_delete(p_Var2,(long)p_Var4[0xd]._M_nxt - (long)p_Var2);
    }
    p_Var2 = p_Var4[8]._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      operator_delete(p_Var2,(long)p_Var4[10]._M_nxt - (long)p_Var2);
    }
    operator_delete(p_Var4,0x98);
  }
  (*___assert_fail)(obj);
  return;
}

Assistant:

inline void pybind11_meta_dealloc(PyObject *obj) {
    auto *type = (PyTypeObject *) obj;
    auto &internals = get_internals();

    // A pybind11-registered type will:
    // 1) be found in internals.registered_types_py
    // 2) have exactly one associated `detail::type_info`
    auto found_type = internals.registered_types_py.find(type);
    if (found_type != internals.registered_types_py.end() &&
        found_type->second.size() == 1 &&
        found_type->second[0]->type == type) {

        auto *tinfo = found_type->second[0];
        auto tindex = std::type_index(*tinfo->cpptype);
        internals.direct_conversions.erase(tindex);

        if (tinfo->module_local)
            registered_local_types_cpp().erase(tindex);
        else
            internals.registered_types_cpp.erase(tindex);
        internals.registered_types_py.erase(tinfo->type);

        // Actually just `std::erase_if`, but that's only available in C++20
        auto &cache = internals.inactive_override_cache;
        for (auto it = cache.begin(), last = cache.end(); it != last; ) {
            if (it->first == (PyObject *) tinfo->type)
                it = cache.erase(it);
            else
                ++it;
        }

        delete tinfo;
    }

    PyType_Type.tp_dealloc(obj);
}